

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::TransitionRenderTargets
          (DeviceContextVkImpl *this,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  TEXTURE_VIEW_TYPE TVar1;
  TextureViewVkImpl *pTVar2;
  ITextureView *pIVar3;
  element_type *peVar4;
  int iVar5;
  undefined4 extraout_var;
  bool bVar7;
  char (*in_RCX) [91];
  undefined7 in_register_00000031;
  VkImageLayout ExpectedLayout;
  ulong uVar8;
  uint uVar9;
  string msg;
  string local_48;
  TextureVkImpl *pTVar6;
  
  if (((int)CONCAT71(in_register_00000031,StateTransitionMode) == 1) &&
     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0)) {
    FormatString<char[56]>
              (&local_48,(char (*) [56])"State transitions are not allowed inside a render pass.");
    in_RCX = (char (*) [91])0x6fb;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"TransitionRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x6fb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  pTVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
  if (pTVar2 != (TextureViewVkImpl *)0x0) {
    TVar1 = (pTVar2->super_TextureViewBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
            .m_Desc.ViewType;
    if (1 < (byte)(TVar1 - TEXTURE_VIEW_DEPTH_STENCIL)) {
      FormatString<char[26],char[91]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL"
                 ,in_RCX);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"TransitionRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x700);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    uVar9 = (uint)(TVar1 == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
    pTVar6 = (TextureVkImpl *)
             (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject)
             ->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture;
    if (pTVar6 != (TextureVkImpl *)0x0) {
      CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>((ITexture *)pTVar6);
    }
    in_RCX = (char (*) [91])0x0;
    TransitionOrVerifyTextureState
              (this,pTVar6,StateTransitionMode,uVar9 * 0x40 + RESOURCE_STATE_DEPTH_WRITE,
               uVar9 + VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
               "Binding depth-stencil buffer (DeviceContextVkImpl::TransitionRenderTargets)");
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets != 0) {
    uVar8 = 0;
    do {
      pTVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets[uVar8].
               m_pObject;
      if (pTVar2 != (TextureViewVkImpl *)0x0) {
        pTVar6 = (TextureVkImpl *)
                 (pTVar2->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture;
        if (pTVar6 != (TextureVkImpl *)0x0) {
          CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>((ITexture *)pTVar6);
        }
        in_RCX = (char (*) [91])0x0;
        TransitionOrVerifyTextureState
                  (this,pTVar6,StateTransitionMode,RESOURCE_STATE_RENDER_TARGET,
                   VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                   "Binding render targets (DeviceContextVkImpl::TransitionRenderTargets)");
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                     super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets);
  }
  pIVar3 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap.m_pObject;
  if (pIVar3 != (ITextureView *)0x0) {
    peVar4 = (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
             m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar5 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[10])();
    pTVar6 = (TextureVkImpl *)CONCAT44(extraout_var,iVar5);
    if (pTVar6 != (TextureVkImpl *)0x0) {
      CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>((ITexture *)pTVar6);
    }
    bVar7 = ((peVar4->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap != 0) !=
            ((peVar4->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate != 0);
    if (!bVar7) {
      FormatString<char[26],char[134]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "(ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE) ^ (ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)"
                 ,(char (*) [134])CONCAT71((int7)((ulong)in_RCX >> 8),bVar7));
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"TransitionRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x71e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    ExpectedLayout = VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR;
    if ((peVar4->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate == 0) {
      ExpectedLayout = VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
    }
    TransitionOrVerifyTextureState
              (this,pTVar6,StateTransitionMode,RESOURCE_STATE_MAX_BIT,ExpectedLayout,
               "Binding shading rate map (DeviceContextVkImpl::TransitionRenderTargets)");
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionRenderTargets(RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    VERIFY(StateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_TRANSITION || m_pActiveRenderPass == nullptr,
           "State transitions are not allowed inside a render pass.");

    if (m_pBoundDepthStencil)
    {
        const TEXTURE_VIEW_TYPE ViewType = m_pBoundDepthStencil->GetDesc().ViewType;
        VERIFY_EXPR(ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
        const bool bReadOnly = ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;

        const RESOURCE_STATE NewState = bReadOnly ?
            RESOURCE_STATE_DEPTH_READ :
            RESOURCE_STATE_DEPTH_WRITE;

        const VkImageLayout ExpectedLayout = bReadOnly ?
            VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL :
            VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;

        TextureVkImpl* pDepthBufferVk = m_pBoundDepthStencil->GetTexture<TextureVkImpl>();
        TransitionOrVerifyTextureState(*pDepthBufferVk, StateTransitionMode, NewState, ExpectedLayout,
                                       "Binding depth-stencil buffer (DeviceContextVkImpl::TransitionRenderTargets)");
    }

    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        if (TextureViewImplType* pRTVVk = m_pBoundRenderTargets[rt])
        {
            TextureVkImpl* pRenderTargetVk = pRTVVk->GetTexture<TextureVkImpl>();
            TransitionOrVerifyTextureState(*pRenderTargetVk, StateTransitionMode, RESOURCE_STATE_RENDER_TARGET, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                                           "Binding render targets (DeviceContextVkImpl::TransitionRenderTargets)");
        }
    }

    if (m_pBoundShadingRateMap)
    {
        const VulkanUtilities::VulkanLogicalDevice::ExtensionFeatures& ExtFeatures       = m_pDevice->GetLogicalDevice().GetEnabledExtFeatures();
        TextureVkImpl*                                                 pShadingRateMapVk = ClassPtrCast<TextureVkImpl>(m_pBoundShadingRateMap->GetTexture());
        VERIFY_EXPR((ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE) ^ (ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE));
        const VkImageLayout vkRequiredLayout = ExtFeatures.ShadingRate.attachmentFragmentShadingRate ?
            VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR :
            VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
        TransitionOrVerifyTextureState(*pShadingRateMapVk, StateTransitionMode, RESOURCE_STATE_SHADING_RATE, vkRequiredLayout,
                                       "Binding shading rate map (DeviceContextVkImpl::TransitionRenderTargets)");
    }
}